

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O1

double finv(double p,int num,int den)

{
  char *__format;
  double dVar1;
  
  if ((p < 0.0) || (1.0 < p)) {
    __format = "Probablity Values can only take values between 0.0 and 1.0";
  }
  else {
    if ((0 < num) && (0 < den)) {
      dVar1 = betainv(p,(double)num * 0.5,(double)den * 0.5);
      return (double)(-(ulong)(p == 1.0) & 0x7fefdcf158adbb99 |
                     ~-(ulong)(p == 1.0) &
                     (ulong)((dVar1 * (double)den) / ((1.0 - dVar1) * (double)num)));
    }
    __format = "Degrees Of Freedom should be positive real integers";
  }
  printf(__format);
  exit(1);
}

Assistant:

double finv(double p, int num,int den) {
	double x,k1,k2,a,b;
	
	if (p < 0. || p > 1.0) {
		printf("Probablity Values can only take values between 0.0 and 1.0");
		exit(1);
	}
	
	if (num <= 0 || den <= 0) {
		printf("Degrees Of Freedom should be positive real integers");
		exit(1);
	}
	
	k1 = (double) num;
	k2 = (double) den;
	
	a = betainv(p,k1/2.,k2/2.);
	b = 1. - a;
	
	x = (k2 * a) / ( k1 * b);
	
	if ( p == 1.) {
		x = XINFVAL;
	}
	
	return x;
}